

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O2

CURLcode tool_setopt(CURL *curl,_Bool str,GlobalConfig *config,char *name,CURLoption tag,...)

{
  bool bVar1;
  int iVar2;
  CURLcode CVar3;
  size_t len;
  char *fmt;
  slist_wc **plist;
  long *plVar4;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  va_list arg;
  char *local_1c0;
  char buf [256];
  
  if (tag < 10000) {
    pcVar5 = (char *)0x0;
    for (plVar4 = &setopt_nv_CURLNONZERODEFAULTS[0].value;
        ((NameValue *)(plVar4 + -1))->name != (char *)0x0; plVar4 = plVar4 + 2) {
      iVar2 = strcmp(name,((NameValue *)(plVar4 + -1))->name);
      if (iVar2 == 0) {
        pcVar5 = (char *)*plVar4;
        break;
      }
    }
    curl_msnprintf(buf,0x100,"%ldL",local_1c0);
    len = (size_t)tag;
    CVar3 = curl_easy_setopt(curl,len,local_1c0);
    bVar6 = local_1c0 == pcVar5;
LAB_0011a184:
    bVar1 = false;
    local_1c0 = buf;
    bVar7 = false;
  }
  else {
    if (29999 < tag) {
      curl_msnprintf(buf,0x100,"(curl_off_t)%ld",local_1c0);
      len = (size_t)tag;
      CVar3 = curl_easy_setopt(curl,len,local_1c0);
      bVar6 = local_1c0 == (char *)0x0;
      goto LAB_0011a184;
    }
    bVar6 = local_1c0 == (char *)0x0;
    if (tag < 20000) {
      if (local_1c0 == (char *)0x0 || !str) {
        pcVar5 = "objectpointer";
        goto LAB_0011a1a6;
      }
      bVar1 = true;
      bVar6 = false;
      bVar7 = false;
    }
    else {
      pcVar5 = "functionpointer";
LAB_0011a1a6:
      bVar7 = local_1c0 != (char *)0x0;
      if (!bVar7) {
        pcVar5 = local_1c0;
      }
      local_1c0 = pcVar5;
      bVar1 = false;
    }
    len = (size_t)tag;
    CVar3 = curl_easy_setopt(curl);
  }
  pcVar5 = (char *)0x0;
  if (((config->libcurl == (char *)0x0) || (bVar6)) || (CVar3 != CURLE_OK)) goto LAB_0011a24b;
  if (bVar7) {
    plist = &easysrc_toohard;
    fmt = "%s set to a %s";
LAB_0011a239:
    pcVar5 = (char *)0x0;
  }
  else {
    if (!bVar1) {
      plist = &easysrc_code;
      fmt = "curl_easy_setopt(hnd, %s, %s);";
      goto LAB_0011a239;
    }
    local_1c0 = c_escape(local_1c0,len);
    if (local_1c0 == (char *)0x0) {
      CVar3 = CURLE_OUT_OF_MEMORY;
      pcVar5 = (char *)0x0;
      goto LAB_0011a24b;
    }
    plist = &easysrc_code;
    fmt = "curl_easy_setopt(hnd, %s, \"%s\");";
    pcVar5 = local_1c0;
  }
  CVar3 = easysrc_addf(plist,fmt,name,local_1c0);
LAB_0011a24b:
  free(pcVar5);
  return CVar3;
}

Assistant:

CURLcode tool_setopt(CURL *curl, bool str, struct GlobalConfig *config,
                     const char *name, CURLoption tag, ...)
{
  va_list arg;
  char buf[256];
  const char *value = NULL;
  bool remark = FALSE;
  bool skip = FALSE;
  bool escape = FALSE;
  char *escaped = NULL;
  CURLcode ret = CURLE_OK;

  va_start(arg, tag);

  if(tag < CURLOPTTYPE_OBJECTPOINT) {
    /* Value is expected to be a long */
    long lval = va_arg(arg, long);
    long defval = 0L;
    const NameValue *nv = NULL;
    for(nv = setopt_nv_CURLNONZERODEFAULTS; nv->name; nv++) {
      if(!strcmp(name, nv->name)) {
        defval = nv->value;
        break; /* found it */
      }
    }

    msnprintf(buf, sizeof(buf), "%ldL", lval);
    value = buf;
    ret = curl_easy_setopt(curl, tag, lval);
    if(lval == defval)
      skip = TRUE;
  }
  else if(tag < CURLOPTTYPE_OFF_T) {
    /* Value is some sort of object pointer */
    void *pval = va_arg(arg, void *);

    /* function pointers are never printable */
    if(tag >= CURLOPTTYPE_FUNCTIONPOINT) {
      if(pval) {
        value = "functionpointer";
        remark = TRUE;
      }
      else
        skip = TRUE;
    }

    else if(pval && str) {
      value = (char *)pval;
      escape = TRUE;
    }
    else if(pval) {
      value = "objectpointer";
      remark = TRUE;
    }
    else
      skip = TRUE;

    ret = curl_easy_setopt(curl, tag, pval);

  }
  else {
    /* Value is expected to be curl_off_t */
    curl_off_t oval = va_arg(arg, curl_off_t);
    msnprintf(buf, sizeof(buf),
              "(curl_off_t)%" CURL_FORMAT_CURL_OFF_T, oval);
    value = buf;
    ret = curl_easy_setopt(curl, tag, oval);

    if(!oval)
      skip = TRUE;
  }

  va_end(arg);

  if(config->libcurl && !skip && !ret) {
    /* we only use this for real if --libcurl was used */

    if(remark)
      REM2("%s set to a %s", name, value);
    else {
      if(escape) {
        escaped = c_escape(value, CURL_ZERO_TERMINATED);
        NULL_CHECK(escaped);
        CODE2("curl_easy_setopt(hnd, %s, \"%s\");", name, escaped);
      }
      else
        CODE2("curl_easy_setopt(hnd, %s, %s);", name, value);
    }
  }

 nomem:
  Curl_safefree(escaped);
  return ret;
}